

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O2

bool __thiscall ON_AngularDimension2Extra::CopyFrom(ON_AngularDimension2Extra *this,ON_Object *src)

{
  ON_AngularDimension2Extra *pOVar1;
  
  pOVar1 = Cast(src);
  if (pOVar1 != (ON_AngularDimension2Extra *)0x0) {
    operator=(this,pOVar1);
  }
  return pOVar1 != (ON_AngularDimension2Extra *)0x0;
}

Assistant:

ON_AngularDimension2Extra* ON_AngularDimension2Extra::AngularDimensionExtra(ON_OBSOLETE_V5_DimAngular* pDim)
{
  ON_AngularDimension2Extra* pExtra = 0;
  if(pDim)
  {
    pExtra = ON_AngularDimension2Extra::Cast(pDim->GetUserData(ON_CLASS_ID(ON_AngularDimension2Extra)));
    if(pExtra == 0)
    {
      pExtra = new ON_AngularDimension2Extra;
      if( pExtra)
      {
        if(!pDim->AttachUserData(pExtra))
        {
          delete pExtra;
          pExtra = 0;
        }
      }
    }
  }
  return pExtra;
}